

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O3

uint32_t MurmurHash2(void *key,int len,uint32_t seed)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = seed ^ len;
  uVar3 = len;
  if (3 < len) {
    do {
      iVar1 = *key;
      key = (void *)((long)key + 4);
      uVar4 = uVar4 * 0x5bd1e995 ^
              ((uint)(iVar1 * 0x5bd1e995) >> 0x18 ^ iVar1 * 0x5bd1e995) * 0x5bd1e995;
      len = uVar3 - 4;
      bVar2 = 7 < uVar3;
      uVar3 = len;
    } while (bVar2);
  }
  if (len != 1) {
    if (len != 2) {
      if (len != 3) goto LAB_001681e8;
      uVar4 = uVar4 ^ (uint)*(byte *)((long)key + 2) << 0x10;
    }
    uVar4 = uVar4 ^ (uint)*(byte *)((long)key + 1) << 8;
  }
  uVar4 = (*key ^ uVar4) * 0x5bd1e995;
LAB_001681e8:
  uVar3 = (uVar4 >> 0xd ^ uVar4) * 0x5bd1e995;
  return uVar3 >> 0xf ^ uVar3;
}

Assistant:

uint32_t MurmurHash2 ( const void * key, int len, uint32_t seed )
{
  // 'm' and 'r' are mixing constants generated offline.
  // They're not really 'magic', they just happen to work well.

  const uint32_t m = 0x5bd1e995;
  const int r = 24;

  // Initialize the hash to a 'random' value

  uint32_t h = seed ^ len;

  // Mix 4 bytes at a time into the hash

  const unsigned char * data = (const unsigned char *)key;

  while(len >= 4)
  {
    uint32_t k = *(uint32_t*)data;

    k *= m;
    k ^= k >> r;
    k *= m;

    h *= m;
    h ^= k;

    data += 4;
    len -= 4;
  }

  // Handle the last few bytes of the input array

  switch(len)
  {
  case 3: h ^= data[2] << 16;
  case 2: h ^= data[1] << 8;
  case 1: h ^= data[0];
      h *= m;
  };

  // Do a few final mixes of the hash to ensure the last few
  // bytes are well-incorporated.

  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;

  return h;
}